

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O3

void * FilterRender::doFlip(void *data,uint width,uint height,bool isLR)

{
  undefined1 uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar4 = (ulong)width;
  uVar13 = (ulong)height;
  pvVar5 = operator_new__(uVar13 * 8);
  if (height != 0) {
    uVar12 = 0;
    do {
      pvVar6 = operator_new__(uVar4 * 8);
      *(void **)((long)pvVar5 + uVar12 * 8) = pvVar6;
      if (width != 0) {
        uVar11 = 0;
        do {
          pvVar7 = operator_new__(4);
          *(void **)((long)pvVar6 + uVar11 * 8) = pvVar7;
          uVar11 = uVar11 + 1;
        } while (uVar4 != uVar11);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar13);
    if (height != 0) {
      uVar12 = 0;
      pvVar6 = data;
      do {
        if (width != 0) {
          lVar8 = *(long *)((long)pvVar5 + uVar12 * 8);
          uVar11 = 0;
          do {
            lVar9 = 0;
            do {
              *(undefined1 *)(*(long *)(lVar8 + uVar11 * 8) + lVar9) =
                   *(undefined1 *)((long)pvVar6 + lVar9);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 4);
            pvVar6 = (void *)((long)pvVar6 + 4);
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar4);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar13);
    }
  }
  if (isLR) {
    if (height == 0) goto LAB_001058f0;
    uVar12 = 0;
    do {
      if (1 < width) {
        lVar8 = *(long *)((long)pvVar5 + uVar12 * 8);
        uVar11 = 0;
        do {
          lVar9 = 0;
          do {
            lVar10 = *(long *)(lVar8 + uVar11 * 8);
            lVar2 = *(long *)(lVar8 + (ulong)(width - (int)uVar11) * 8);
            uVar1 = *(undefined1 *)(lVar10 + lVar9);
            *(undefined1 *)(lVar10 + lVar9) = *(undefined1 *)(lVar2 + lVar9);
            *(undefined1 *)(lVar2 + lVar9) = uVar1;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          uVar11 = uVar11 + 1;
        } while (uVar11 != width >> 1);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar13);
  }
  else if (1 < height) {
    uVar12 = 0;
    do {
      if (width != 0) {
        lVar8 = *(long *)((long)pvVar5 + uVar12 * 8);
        lVar9 = *(long *)((long)pvVar5 + (ulong)(height - (int)uVar12) * 8);
        uVar11 = 0;
        do {
          lVar10 = 0;
          do {
            lVar2 = *(long *)(lVar8 + uVar11 * 8);
            lVar3 = *(long *)(lVar9 + uVar11 * 8);
            uVar1 = *(undefined1 *)(lVar2 + lVar10);
            *(undefined1 *)(lVar2 + lVar10) = *(undefined1 *)(lVar3 + lVar10);
            *(undefined1 *)(lVar3 + lVar10) = uVar1;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar4);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != height >> 1);
  }
  if (height != 0) {
    uVar12 = 0;
    do {
      if (width != 0) {
        uVar11 = 0;
        do {
          lVar8 = 0;
          do {
            *(undefined1 *)((long)data + lVar8) =
                 *(undefined1 *)
                  (*(long *)(*(long *)((long)pvVar5 + uVar12 * 8) + uVar11 * 8) + lVar8);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          data = (void *)((long)data + 4);
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar4);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar13);
    if (height != 0) {
      uVar12 = 0;
      do {
        pvVar6 = *(void **)((long)pvVar5 + uVar12 * 8);
        if (width != 0) {
          uVar13 = 0;
          do {
            pvVar5 = *(void **)((long)pvVar6 + uVar13 * 8);
            if (pvVar5 != (void *)0x0) {
              operator_delete__(pvVar5);
            }
            uVar13 = uVar13 + 1;
          } while (uVar4 != uVar13);
LAB_001058e0:
          operator_delete__(pvVar6);
        }
        if (pvVar6 != (void *)0x0) goto LAB_001058e0;
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar13);
    }
  }
LAB_001058f0:
  operator_delete__(pvVar5);
}

Assistant:

void* FilterRender::doFlip(void *data, uint width, uint height, bool isLR) {
	unsigned char ***map;

	map = new unsigned char**[height];
	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	if (isLR) {
		for (int i = 0; i < height; i++) {
			for (int j = 0; j < width / 2; j++) {
				for (int k = 0; k < 4; k++) {
					swap(map[i][j][k], map[i][width - j][k]);
				}
			}
		}
	} else {
		for (int i = 0; i < height / 2; i++) {
			for (int j = 0; j < width; j++) {
				for (int k = 0; k < 4; k++) {
					swap(map[i][j][k], map[height - i][j][k]);
				}
			}
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}